

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cc
# Opt level: O1

RefCountedPtr<raptor::Status> __thiscall raptor::Epoll::create(Epoll *this)

{
  int iVar1;
  int *in_RSI;
  char *api;
  
  if (*in_RSI < 1) {
    iVar1 = epoll_create(100);
    *in_RSI = iVar1;
    if (iVar1 < 0) {
      api = "epoll_create";
    }
    else {
      iVar1 = fcntl(iVar1,2,1);
      if (iVar1 == 0) goto LAB_0010790a;
      api = "fcntl";
    }
    MakeStatusFromPosixError((raptor *)this,api);
  }
  else {
LAB_0010790a:
    this->_epoll_fd = 0;
    this->_events[0].events = 0;
  }
  return (RefCountedPtr<raptor::Status>)(Status *)this;
}

Assistant:

RefCountedPtr<Status> Epoll::create() {
    if (_epoll_fd > 0) {
        return RAPTOR_ERROR_NONE;
    }

    _epoll_fd = epoll_create(MAX_EPOLL_EVENTS);
    if (_epoll_fd < 0) {
        return RAPTOR_POSIX_ERROR("epoll_create");
    }
    if (fcntl(_epoll_fd, F_SETFD, FD_CLOEXEC) != 0) {
        return RAPTOR_POSIX_ERROR("fcntl");
    }
    return RAPTOR_ERROR_NONE;
}